

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.hpp
# Opt level: O0

void __thiscall limonp::Logger::~Logger(Logger *this)

{
  ostream *this_00;
  ostringstream *in_RDI;
  string local_28 [40];
  
  std::__cxx11::ostringstream::str();
  this_00 = std::operator<<((ostream *)&std::cerr,local_28);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_28);
  if (*(long *)(in_RDI + 0x178) == 4) {
    abort();
  }
  std::__cxx11::ostringstream::~ostringstream(in_RDI);
  return;
}

Assistant:

~Logger() {
#ifdef LOGGING_LEVEL
     if (level_ < LOGGING_LEVEL) {
       return;
     }
#endif
    std::cerr << stream_.str() << std::endl;
    if (level_ == LL_FATAL) {
      abort();
    }
  }